

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

void BrotliEncoderDestroyPreparedDictionary(BrotliEncoderPreparedDictionary *dictionary)

{
  SharedEncoderDictionary *dict;
  
  if ((dictionary != (BrotliEncoderPreparedDictionary *)0x0) && (*(int *)dictionary == -0x2143121e))
  {
    dict = *(SharedEncoderDictionary **)(dictionary + 0x20);
    if (dict != (SharedEncoderDictionary *)0x0) {
      if (dict->magic == 0xdebcede1) {
        duckdb_brotli::BrotliCleanupSharedEncoderDictionary((MemoryManager *)(dictionary + 8),dict);
        duckdb_brotli::BrotliFree((MemoryManager *)(dictionary + 8),*(void **)(dictionary + 0x20));
      }
      else if (dict->magic == 0xdebcede3) {
        duckdb_brotli::DestroyPreparedDictionary
                  ((MemoryManager *)(dictionary + 8),(PreparedDictionary *)dict);
      }
    }
    *(undefined8 *)(dictionary + 0x20) = 0;
    duckdb_brotli::BrotliDestroyManagedDictionary((ManagedDictionary *)dictionary);
    return;
  }
  return;
}

Assistant:

void BrotliEncoderDestroyPreparedDictionary(
    BrotliEncoderPreparedDictionary* dictionary) {
  ManagedDictionary* dict = (ManagedDictionary*)dictionary;
  if (!dictionary) return;
  /* First field of dictionary structs. */
  /* Only managed dictionaries are eligible for destruction by this method. */
  if (dict->magic != kManagedDictionaryMagic) {
    return;
  }
  if (dict->dictionary == NULL) {
    /* This should never ever happen. */
  } else if (*dict->dictionary == kLeanPreparedDictionaryMagic) {
    DestroyPreparedDictionary(
        &dict->memory_manager_, (PreparedDictionary*)dict->dictionary);
  } else if (*dict->dictionary == kSharedDictionaryMagic) {
    BrotliCleanupSharedEncoderDictionary(&dict->memory_manager_,
        (SharedEncoderDictionary*)dict->dictionary);
    BrotliFree(&dict->memory_manager_, dict->dictionary);
  } else {
    /* There is also kPreparedDictionaryMagic, but such instances should be
     * constructed and destroyed by different means. */
  }
  dict->dictionary = NULL;
  BrotliDestroyManagedDictionary(dict);
}